

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.cpp
# Opt level: O1

void __thiscall
iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)0>::initializeMatrix
          (SparseMatrix<(iDynTree::MatrixStorageOrdering)0> *this,size_t outerSize,double *vector,
          size_t vectorSize)

{
  size_t sVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  double dVar4;
  value_type_conflict local_1c;
  
  local_1c = 0;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&this->m_outerStarts,outerSize + 1,&local_1c);
  if (vectorSize != 0) {
    uVar2 = this->m_allocatedSize;
    sVar1 = 0;
    do {
      auVar3._8_4_ = (int)(uVar2 >> 0x20);
      auVar3._0_8_ = uVar2;
      auVar3._12_4_ = 0x45300000;
      dVar4 = (auVar3._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0) + vector[sVar1];
      uVar2 = (ulong)dVar4;
      uVar2 = (long)(dVar4 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2;
      sVar1 = sVar1 + 1;
    } while (vectorSize != sVar1);
    this->m_allocatedSize = uVar2;
  }
  VectorDynSize::reserve(&this->m_values,this->m_allocatedSize);
  std::vector<int,_std::allocator<int>_>::reserve(&this->m_innerIndices,this->m_allocatedSize);
  return;
}

Assistant:

void SparseMatrix<ordering>::initializeMatrix(std::size_t outerSize, const double* vector, std::size_t vectorSize)
    {
        m_outerStarts.assign(outerSize + 1, 0);

        for (std::size_t i = 0; i < vectorSize; ++i) {
            m_allocatedSize += vector[i];
        }

        m_values.reserve(m_allocatedSize);

        // Inner indeces has same size of values
        m_innerIndices.reserve(m_allocatedSize);
    }